

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q4_1_ref(float *x,block_q4_1 *y,int64_t k)

{
  undefined1 uVar1;
  char cVar2;
  ggml_fp16_t gVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  uint8_t xi1;
  uint8_t xi0;
  float x1;
  float x0;
  int j_1;
  float id;
  float d;
  float v;
  int j;
  float max;
  float min;
  int i;
  int nb;
  int qk;
  undefined4 local_50;
  undefined4 local_40;
  undefined4 local_30;
  float fVar6;
  undefined4 local_28;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < (int)(in_RDX / 0x20); local_24 = local_24 + 1) {
    local_28 = 3.4028235e+38;
    fVar6 = -3.4028235e+38;
    for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
      fVar5 = *(float *)(in_RDI + (long)(local_24 * 0x20 + local_30) * 4);
      if (fVar5 < local_28) {
        local_28 = fVar5;
      }
      if (fVar6 < fVar5) {
        fVar6 = fVar5;
      }
    }
    local_50 = (fVar6 - local_28) / 15.0;
    if ((local_50 != 0.0) || (NAN(local_50))) {
      local_50 = 1.0 / local_50;
    }
    else {
      local_50 = 0.0;
    }
    gVar3 = ggml_compute_fp32_to_fp16(fVar6);
    *(ggml_fp16_t *)(in_RSI + (long)local_24 * 0x14) = gVar3;
    gVar3 = ggml_compute_fp32_to_fp16(fVar6);
    *(ggml_fp16_t *)(in_RSI + (long)local_24 * 0x14 + 2) = gVar3;
    for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
      fVar6 = (*(float *)(in_RDI + (long)(local_24 * 0x20 + local_40) * 4) - local_28) * local_50;
      fVar5 = (*(float *)(in_RDI + (long)(local_24 * 0x20 + 0x10 + local_40) * 4) - local_28) *
              local_50;
      if ((char)(int)(fVar6 + 0.5) < '\x10') {
        uVar1 = (undefined1)(int)(fVar6 + 0.5);
      }
      else {
        uVar1 = 0xf;
      }
      if ((char)(int)(fVar5 + 0.5) < '\x10') {
        cVar2 = (char)(int)(fVar5 + 0.5);
      }
      else {
        cVar2 = '\x0f';
      }
      *(undefined1 *)(in_RSI + (long)local_24 * 0x14 + 4 + (long)local_40) = uVar1;
      lVar4 = in_RSI + (long)local_24 * 0x14;
      *(byte *)(lVar4 + 4 + (long)local_40) = *(byte *)(lVar4 + 4 + (long)local_40) | cVar2 << 4;
    }
  }
  return;
}

Assistant:

void quantize_row_q4_1_ref(const float * GGML_RESTRICT x, block_q4_1 * GGML_RESTRICT y, int64_t k) {
    const int qk = QK4_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        float min = FLT_MAX;
        float max = -FLT_MAX;

        for (int j = 0; j < qk; j++) {
            const float v = x[i*qk + j];

            if (v < min) min = v;
            if (v > max) max = v;
        }

        const float d  = (max - min) / ((1 << 4) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);
        y[i].m = GGML_FP32_TO_FP16(min);

        for (int j = 0; j < qk/2; ++j) {
            const float x0 = (x[i*qk + 0    + j] - min)*id;
            const float x1 = (x[i*qk + qk/2 + j] - min)*id;

            const uint8_t xi0 = MIN(15, (int8_t)(x0 + 0.5f));
            const uint8_t xi1 = MIN(15, (int8_t)(x1 + 0.5f));

            y[i].qs[j]  = xi0;
            y[i].qs[j] |= xi1 << 4;
        }
    }
}